

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

void __thiscall ON_ClippingPlaneSurface::Default(ON_ClippingPlaneSurface *this)

{
  ON_ClippingPlaneSurface *this_local;
  
  ON_ClippingPlane::Default(&this->m_clipping_plane);
  memcpy(&(this->super_ON_PlaneSurface).m_plane,&this->m_clipping_plane,0x80);
  ON_Interval::Set((ON_Interval *)&(this->super_ON_PlaneSurface).field_0x90,0.0,1.0);
  ON_Interval::Set((ON_Interval *)&(this->super_ON_PlaneSurface).field_0xa0,0.0,1.0);
  ON_Interval::Set((ON_Interval *)&(this->super_ON_PlaneSurface).field_0xb0,-1.0,1.0);
  ON_Interval::Set((ON_Interval *)&(this->super_ON_PlaneSurface).field_0xc0,-1.0,1.0);
  return;
}

Assistant:

void ON_ClippingPlaneSurface::Default()
{
  m_clipping_plane.Default();
  m_plane = m_clipping_plane.m_plane;
  m_domain[0].Set(0.0,1.0);
  m_domain[1].Set(0.0,1.0);
  m_extents[0].Set(-1.0,1.0);
  m_extents[1].Set(-1.0,1.0);
}